

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O3

TestStatus * __thiscall
vkt::api::anon_unknown_1::createSingleTest<vkt::api::(anonymous_namespace)::Framebuffer>
          (TestStatus *__return_storage_ptr__,anon_unknown_1 *this,undefined8 param_3,
          Parameters *param_4)

{
  Parameters *extraout_RDX;
  Unique<vk::Handle<(vk::HandleType)23>_> obj;
  Environment env;
  Resources res;
  VkFramebuffer local_198;
  Deleter<vk::Handle<(vk::HandleType)23>_> DStack_190;
  Move<vk::Handle<(vk::HandleType)23>_> local_178;
  Environment local_158;
  Resources local_120;
  
  local_158.vkp = *(PlatformInterface **)(this + 8);
  local_158.vkd = Context::getDeviceInterface((Context *)this);
  local_158.device = Context::getDevice((Context *)this);
  local_158.queueFamilyIndex = Context::getUniversalQueueFamilyIndex((Context *)this);
  local_158.programBinaries = *(BinaryCollection **)(this + 0x10);
  local_158.allocationCallbacks = (VkAllocationCallbacks *)0x0;
  local_158.maxResourceConsumers = 1;
  Framebuffer::Resources::Resources(&local_120,&local_158,extraout_RDX);
  Framebuffer::create(&local_178,&local_158,&local_120,param_4);
  DStack_190.m_device =
       local_178.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_device;
  DStack_190.m_allocator =
       local_178.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_allocator;
  local_198.m_internal._4_4_ =
       local_178.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.object.m_internal._4_4_;
  local_198.m_internal._0_4_ =
       (undefined4)local_178.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.object.m_internal
  ;
  DStack_190.m_deviceIface._0_4_ =
       local_178.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_deviceIface._0_4_;
  DStack_190.m_deviceIface._4_4_ =
       local_178.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_deviceIface._4_4_;
  if (local_198.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)23>_>::operator()(&DStack_190,local_198);
  }
  local_198.m_internal = (deUint64)&DStack_190.m_device;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_198,"Ok","");
  __return_storage_ptr__->m_code = QP_TEST_RESULT_PASS;
  (__return_storage_ptr__->m_description)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->m_description).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&__return_storage_ptr__->m_description,local_198.m_internal,
             (undefined1 *)
             (CONCAT44(DStack_190.m_deviceIface._4_4_,DStack_190.m_deviceIface._0_4_) +
             local_198.m_internal));
  if ((VkDevice *)local_198.m_internal != &DStack_190.m_device) {
    operator_delete((void *)local_198.m_internal,(ulong)(DStack_190.m_device + 1));
  }
  Framebuffer::Resources::~Resources(&local_120);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus createSingleTest (Context& context, typename Object::Parameters params)
{
	const Environment					env	(context, 1u);
	const typename Object::Resources	res	(env, params);

	{
		Unique<typename Object::Type>	obj	(Object::create(env, res, params));
	}

	return tcu::TestStatus::pass("Ok");
}